

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_connect_op.hpp
# Opt level: O2

void __thiscall
asio::detail::
reactive_socket_connect_op<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_asio::any_io_executor>
::reactive_socket_connect_op
          (reactive_socket_connect_op<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_asio::any_io_executor>
           *this,error_code *success_ec,socket_type socket,
          iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>
          *handler,any_io_executor *io_ex)

{
  error_category *peVar1;
  undefined4 uVar2;
  
  (this->super_reactive_socket_connect_op_base).super_reactor_op.super_operation.next_ =
       (scheduler_operation *)0x0;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.super_operation.func_ = do_complete
  ;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.super_operation.task_result_ = 0;
  uVar2 = *(undefined4 *)&success_ec->field_0x4;
  peVar1 = success_ec->_M_cat;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_value = success_ec->_M_value
  ;
  *(undefined4 *)&(this->super_reactive_socket_connect_op_base).super_reactor_op.ec_.field_0x4 =
       uVar2;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.ec_._M_cat = peVar1;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.cancellation_key_ = (void *)0x0;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.bytes_transferred_ = 0;
  (this->super_reactive_socket_connect_op_base).super_reactor_op.perform_func_ =
       reactive_socket_connect_op_base::do_perform;
  (this->super_reactive_socket_connect_op_base).socket_ = socket;
  iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>
  ::iterator_connect_op(&this->handler_,handler);
  handler_work<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_asio::any_io_executor,_void>
  ::handler_work(&this->work_,&this->handler_,io_ex);
  return;
}

Assistant:

reactive_socket_connect_op(const asio::error_code& success_ec,
      socket_type socket, Handler& handler, const IoExecutor& io_ex)
    : reactive_socket_connect_op_base(success_ec, socket,
        &reactive_socket_connect_op::do_complete),
      handler_(ASIO_MOVE_CAST(Handler)(handler)),
      work_(handler_, io_ex)
  {
  }